

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

int lws_h2_parse_end_of_frame(lws *wsi)

{
  undefined1 *puVar1;
  lws_tx_credit *txc;
  byte bVar2;
  uint8_t uVar3;
  lws_h2_netconn *plVar4;
  allocated_headers *paVar5;
  undefined8 uVar6;
  addrinfo *paVar7;
  lws_conmon_interval_us_t lVar8;
  lws_conmon_interval_us_t lVar9;
  int iVar10;
  int iVar11;
  lws *plVar12;
  lws_h2_protocol_send *plVar13;
  ulong uVar14;
  char *pcVar15;
  lws_filepos_t lVar16;
  uchar *puVar17;
  uint uVar18;
  char *pcVar19;
  lws_token_indexes h;
  uint32_t uVar20;
  lws_h2_states lVar21;
  int *piVar22;
  lws *wsi_00;
  long lVar23;
  char buf [256];
  char acStack_138 [16];
  lws *in_stack_fffffffffffffed8;
  
  plVar4 = (wsi->h2).h2n;
  plVar4->frame_state = '\0';
  plVar4->count = 0;
  if (plVar4->sid == 0) {
    uVar14 = 0;
  }
  else {
    plVar12 = lws_wsi_mux_from_id(wsi,plVar4->sid);
    plVar4->swsi = plVar12;
    uVar18 = plVar4->sid;
    uVar14 = (ulong)uVar18;
    if (plVar4->highest_sid < uVar18) {
      plVar4->highest_sid = uVar18;
    }
  }
  if (((char)*(ushort *)&plVar4->field_0xa8 < '\0') && ((plVar4->dep & 0x7fffffff) == (uint)uVar14))
  {
    pcVar19 = "depends on own sid";
LAB_00125639:
    uVar20 = 1;
LAB_00125641:
    lws_h2_goaway(wsi,uVar20,pcVar19);
    return 0;
  }
  iVar11 = 0;
  switch((ulong)plVar4->type) {
  case 0:
    _lws_log(8,"%s: DATA flags 0x%x\n","lws_h2_parse_end_of_frame",(ulong)plVar4->flags);
    if (plVar4->swsi == (lws *)0x0) {
      return 0;
    }
    iVar11 = lws_hdr_total_length(plVar4->swsi,WSI_TOKEN_HTTP_CONTENT_LENGTH);
    plVar12 = plVar4->swsi;
    bVar2 = (plVar12->h2).field_0x11;
    if (iVar11 == 0) {
      if ((bVar2 & 1) != 0) goto LAB_00125d24;
    }
    else if ((bVar2 & 1) != 0) {
      if (((plVar12->http).rx_content_length != 0) && ((plVar12->http).rx_content_remain != 0)) {
        pcVar19 = "Not enough rx content";
        uVar20 = 1;
LAB_00125c63:
        lws_h2_rst_stream(plVar12,uVar20,pcVar19);
        return 0;
      }
LAB_00125d24:
      if ((plVar12->h2).h2_state == '\x03') {
        lws_h2_state(plVar12,LWS_H2_STATE_HALF_CLOSED_REMOTE);
        plVar12 = plVar4->swsi;
        if (((plVar12->h2).field_0x11 & 1) == 0) goto LAB_00125d61;
      }
      if ((plVar12->h2).h2_state == '\x05') {
        lws_h2_state(plVar12,LWS_H2_STATE_CLOSED);
        plVar12 = plVar4->swsi;
      }
    }
LAB_00125d61:
    if ((plVar12->field_0x475 & 8) == 0) {
      return 0;
    }
    if ((plVar4->flags & 1) == 0) {
      return 0;
    }
    pcVar19 = lws_wsi_tag(plVar12);
    _lws_log(8,"%s: %s: DATA: end stream\n","lws_h2_parse_end_of_frame",pcVar19);
    plVar12 = plVar4->swsi;
    if ((plVar12->h2).h2_state == '\x03') {
      lws_h2_state(plVar12,LWS_H2_STATE_HALF_CLOSED_REMOTE);
      plVar12 = plVar4->swsi;
    }
    lws_h2_state(plVar12,LWS_H2_STATE_CLOSED);
    plVar12 = plVar4->swsi;
    goto LAB_00125dd9;
  case 1:
  case 9:
    plVar12 = plVar4->swsi;
    if (plVar12 == (lws *)0x0) {
      return 0;
    }
    if ((*(ushort *)&plVar4->field_0xa8 >> 10 & 1) != 0) {
      pcVar19 = "dyntable resize last in headers";
LAB_00125d0d:
      uVar20 = 9;
LAB_00125d15:
      lws_h2_goaway(wsi,uVar20,pcVar19);
      return 0;
    }
    if (((plVar12->h2).field_0x11 & 2) == 0) {
      _lws_log(8,"witholding http action for continuation\n");
      plVar4->cont_exp_sid = plVar4->sid;
      plVar4->field_0xa8 = plVar4->field_0xa8 | 8;
      return 0;
    }
    if (plVar4->hpack != HPKS_TYPE) {
      _lws_log(8,"hpack incomplete %d (type %d, len %u)\n",(ulong)plVar4->hpack,(ulong)plVar4->type,
               (ulong)plVar4->hpack_len);
      pcVar19 = "hpack incomplete";
      goto LAB_00125d0d;
    }
    uVar3 = (plVar12->h2).h2_state;
    if (uVar3 == '\0') {
      lVar21 = LWS_H2_STATE_OPEN;
LAB_00125ea7:
      lws_h2_state(plVar12,lVar21);
    }
    else if (uVar3 == '\x02') {
      lVar21 = LWS_H2_STATE_HALF_CLOSED_LOCAL;
      goto LAB_00125ea7;
    }
    pcVar19 = lws_wsi_tag(wsi);
    pcVar15 = lws_wsi_tag(plVar4->swsi);
    _lws_log(8,"http req, %s, h2n->swsi=%s\n",pcVar19,pcVar15);
    puVar1 = &plVar4->swsi->field_0x46e;
    *(ulong *)puVar1 = *(ulong *)puVar1 | 1;
    plVar12 = plVar4->swsi;
    if ((plVar12->field_0x475 & 8) != 0) {
      iVar11 = lws_client_interpret_server_handshake(in_stack_fffffffffffffed8);
      if (iVar11 != 0) {
        _lws_log(8,"%s: cli int serv hs closed, or redir\n","lws_h2_parse_end_of_frame");
        return 2;
      }
      plVar12 = plVar4->swsi;
    }
    iVar11 = lws_hdr_extant(plVar12,WSI_TOKEN_HTTP_CONTENT_LENGTH);
    if (iVar11 != 0) {
      pcVar19 = lws_hdr_simple_ptr(plVar4->swsi,WSI_TOKEN_HTTP_CONTENT_LENGTH);
      if (pcVar19 == (char *)0x0) goto LAB_001257d8;
      lVar16 = atoll(pcVar19);
      plVar12 = plVar4->swsi;
      (plVar12->http).rx_content_length = lVar16;
      (plVar12->http).rx_content_remain = lVar16;
      puVar1 = &(plVar12->http).field_0x90;
      *puVar1 = *puVar1 | 4;
      _lws_log(8,"setting rx_content_length %lld\n",(plVar4->swsi->http).rx_content_length);
    }
    puVar17 = lws_token_to_string(WSI_TOKEN_GET_URI);
    if (puVar17 != (uchar *)0x0) {
      h = WSI_TOKEN_GET_URI;
      do {
        iVar11 = lws_hdr_total_length(plVar4->swsi,h);
        if (iVar11 < 0x100 && iVar11 != 0) {
          iVar11 = lws_hdr_copy(plVar4->swsi,acStack_138,0x100,h);
          if (iVar11 < 0) {
            _lws_log(8,"    %s !oversize!\n",puVar17);
          }
          else {
            _lws_log(8,"    %s = %s\n",puVar17,acStack_138);
          }
        }
        h = h + WSI_TOKEN_POST_URI;
        puVar17 = lws_token_to_string(h);
      } while (puVar17 != (uchar *)0x0);
    }
    plVar12 = plVar4->swsi;
    switch((plVar12->h2).h2_state) {
    case '\0':
      lVar21 = LWS_H2_STATE_OPEN;
      goto LAB_0012608f;
    default:
      goto switchD_0012605d_caseD_1;
    case '\x03':
      lVar21 = LWS_H2_STATE_HALF_CLOSED_REMOTE;
      break;
    case '\x04':
    case '\x06':
      pcVar19 = "Banning service on CLOSED_REMOTE";
      uVar20 = 5;
      goto LAB_00125641;
    case '\x05':
      lVar21 = LWS_H2_STATE_CLOSED;
    }
    if (((plVar12->h2).field_0x11 & 1) != 0) {
LAB_0012608f:
      lws_h2_state(plVar12,lVar21);
    }
switchD_0012605d_caseD_1:
    plVar12 = plVar4->swsi;
    if ((*(ulong *)&plVar12->field_0x46e & 0x800000000000000) == 0 ||
        (plVar12->h2).h2_state != '\x06') {
      if ((*(ulong *)&plVar12->field_0x46e & 0x800000000000000) != 0) {
        pcVar19 = lws_wsi_tag(wsi);
        _lws_log(8,"%s: %s: headers: client path (h2 state %s)\n","lws_h2_parse_end_of_frame",
                 pcVar19,h2_state_names[(plVar4->swsi->h2).h2_state]);
        return 0;
      }
      iVar11 = lws_hdr_total_length(plVar12,WSI_TOKEN_HTTP_COLON_PATH);
      if ((((iVar11 == 0) ||
           (iVar11 = lws_hdr_total_length(plVar4->swsi,WSI_TOKEN_HTTP_COLON_METHOD), iVar11 == 0))
          || (iVar11 = lws_hdr_total_length(plVar4->swsi,WSI_TOKEN_HTTP_COLON_SCHEME), iVar11 == 0))
         || ((iVar11 = lws_hdr_total_length(plVar4->swsi,WSI_TOKEN_HTTP_COLON_STATUS), iVar11 != 0
             || (iVar11 = lws_hdr_extant(plVar4->swsi,WSI_TOKEN_CONNECTION), iVar11 != 0)))) {
        pcVar19 = "Pseudoheader checks";
        goto LAB_00125639;
      }
      iVar11 = lws_hdr_extant(plVar4->swsi,WSI_TOKEN_TE);
      if (iVar11 != 0) {
        iVar11 = lws_hdr_total_length(plVar4->swsi,WSI_TOKEN_TE);
        if ((iVar11 == 8) &&
           (pcVar19 = lws_hdr_simple_ptr(plVar4->swsi,WSI_TOKEN_TE), pcVar19 != (char *)0x0)) {
          pcVar19 = lws_hdr_simple_ptr(plVar4->swsi,WSI_TOKEN_TE);
          iVar11 = strncmp(pcVar19,"trailers",8);
          if (iVar11 == 0) goto LAB_00126213;
        }
        pcVar19 = "Illegal transfer-encoding";
        goto LAB_00125639;
      }
LAB_00126213:
      pcVar19 = lws_hdr_simple_ptr(plVar4->swsi,WSI_TOKEN_HTTP_COLON_METHOD);
      lVar23 = 0;
      piVar22 = &method_names_rel;
      do {
        if ((pcVar19 != (char *)0x0) &&
           (iVar11 = strcasecmp(pcVar19,(char *)((long)&method_names_rel + (long)*piVar22)),
           iVar11 == 0)) {
          paVar5 = (plVar4->swsi->http).ah;
          paVar5->frag_index[""[lVar23]] = paVar5->frag_index[0x25];
          break;
        }
        lVar23 = lVar23 + 1;
        piVar22 = piVar22 + 1;
      } while (lVar23 != 8);
      _lws_log(0x10,"%s: setting DEF_ACT from 0x%x\n","lws_h2_parse_end_of_frame",
               (ulong)plVar4->swsi->wsistate);
      lwsi_set_state(plVar4->swsi,0x110);
      plVar12 = plVar4->swsi;
      goto LAB_00125e61;
    }
LAB_00125dd9:
    iVar11 = 0;
    lws_h2_rst_stream(plVar12,0,"client done");
    iVar10 = lws_http_transaction_completed_client((lws *)0x125dec);
    if (iVar10 != 0) {
      iVar11 = 0;
      _lws_log(0x10,"tx completed returned close\n");
    }
    break;
  case 3:
    iVar11 = 0;
    _lws_log(8,"LWS_H2_FRAME_TYPE_RST_STREAM: sid %u: reason 0x%x\n",uVar14,
             (ulong)plVar4->hpack_e_dep);
    break;
  case 4:
    if ((*(ulong *)&wsi->field_0x46e & 0x1400000000000000) != 0x400000000000000) {
      return 0;
    }
    if ((plVar4->flags & 1) != 0) {
      return 0;
    }
    (wsi->http).fop_fd = (lws_fop_fd_t)0x0;
    _lws_log(8,"%s: migrating\n","lws_h2_parse_end_of_frame");
    wsi->field_0x475 = wsi->field_0x475 | 0x10;
    plVar12 = __lws_wsi_server_new((wsi->a).vhost,wsi,1);
    plVar4->swsi = plVar12;
    if (plVar12 == (lws *)0x0) {
      return 1;
    }
    plVar4->sid = 1;
    plVar12 = lws_wsi_mux_from_id(wsi,1);
    if (plVar12 != plVar4->swsi) {
      __assert_fail("lws_wsi_mux_from_id(wsi, 1) == h2n->swsi",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/roles/h2/http2.c"
                    ,0x5d0,"int lws_h2_parse_end_of_frame(struct lws *)");
    }
    lws_role_transition(plVar4->swsi,0x10000000,LRS_H2_WAITING_TO_SEND_HEADERS,&role_ops_h2);
    plVar12 = plVar4->swsi;
    (plVar12->http).ah = (wsi->http).ah;
    puVar1 = &plVar12->field_0x475;
    *puVar1 = *puVar1 | 8;
    puVar1 = &plVar4->swsi->field_0x46e;
    *(ulong *)puVar1 = *(ulong *)puVar1 | 0x400000000000000;
    plVar12 = plVar4->swsi;
    plVar12->flags = wsi->flags;
    uVar6 = *(undefined8 *)((long)&(wsi->conmon).peer46 + 8);
    paVar7 = (wsi->conmon).dns_results_copy;
    lVar8 = (wsi->conmon).ciu_dns;
    lVar9 = (wsi->conmon).ciu_sockconn;
    *(undefined8 *)&(plVar12->conmon).peer46 = *(undefined8 *)&(wsi->conmon).peer46;
    *(undefined8 *)((long)&(plVar12->conmon).peer46 + 8) = uVar6;
    (plVar12->conmon).dns_results_copy = paVar7;
    (plVar12->conmon).ciu_dns = lVar8;
    (plVar12->conmon).ciu_sockconn = lVar9;
    lVar8 = (wsi->conmon).ciu_txn_resp;
    (plVar12->conmon).ciu_tls = (wsi->conmon).ciu_tls;
    (plVar12->conmon).ciu_txn_resp = lVar8;
    plVar12 = plVar4->swsi;
    plVar12->conmon_datum = wsi->conmon_datum;
    uVar6 = *(undefined8 *)((long)&wsi->sa46_peer + 8);
    *(undefined8 *)&plVar12->sa46_peer = *(undefined8 *)&wsi->sa46_peer;
    *(undefined8 *)((long)&plVar12->sa46_peer + 8) = uVar6;
    (wsi->conmon).dns_results_copy = (addrinfo *)0x0;
    plVar12 = plVar4->swsi;
    (plVar12->a).protocol = (wsi->a).protocol;
    if ((plVar12->user_space != (void *)0x0) && ((plVar12->field_0x46f & 8) == 0)) {
      lws_realloc(plVar12->user_space,0,"lws_free");
      plVar12 = plVar4->swsi;
    }
    plVar12->user_space = wsi->user_space;
    *(ulong *)&plVar12->field_0x46e =
         *(ulong *)&plVar12->field_0x46e & 0xfffffffffffff7ff |
         (ulong)((uint)*(undefined8 *)&wsi->field_0x46e & 0x800);
    plVar12 = plVar4->swsi;
    (plVar12->a).opaque_user_data = (wsi->a).opaque_user_data;
    (wsi->a).opaque_user_data = (void *)0x0;
    (plVar12->txc).manual_initial_tx_credit = (wsi->txc).manual_initial_tx_credit;
    lws_strncpy(plVar12->alpn,wsi->alpn,0x18);
    wsi->user_space = (void *)0x0;
    paVar5 = (plVar4->swsi->http).ah;
    if (paVar5 != (allocated_headers *)0x0) {
      paVar5->wsi = plVar4->swsi;
    }
    (wsi->http).ah = (allocated_headers *)0x0;
    pcVar19 = lws_wsi_tag(wsi);
    pcVar15 = lws_wsi_tag(plVar4->swsi);
    _lws_log(8,"%s: MIGRATING nwsi %s -> swsi %s\n","lws_h2_parse_end_of_frame",pcVar19,pcVar15);
    plVar12 = plVar4->swsi;
    (plVar12->txc).tx_cr = (plVar4->peer_set).s[4];
    pcVar19 = lws_wsi_tag(plVar12);
    _lws_log(8,"%s: initial tx credit on %s: %d\n","lws_h2_parse_end_of_frame",pcVar19,
             (ulong)(uint)(plVar4->swsi->txc).tx_cr);
    puVar1 = &(plVar4->swsi->h2).field_0x11;
    *puVar1 = *puVar1 | 0x10;
    if (((wsi->h2).field_0x11 & 0x10) == 0) {
      (wsi->txc).tx_cr = (plVar4->peer_set).s[4];
      pcVar19 = lws_wsi_tag(wsi);
      _lws_log(8,"%s: initial tx credit for us to write on nwsi %s: %d\n",
               "lws_h2_parse_end_of_frame",pcVar19,(ulong)(uint)(wsi->txc).tx_cr);
      puVar1 = &(wsi->h2).field_0x11;
      *puVar1 = *puVar1 | 0x10;
    }
    lws_callback_on_writable(plVar4->swsi);
    if (((wsi->field_0x46e & 0x40) != 0) && ((wsi->flags & 0x20) != 0)) {
LAB_00125bc5:
      lws_wsi_mux_apply_queue(wsi);
      return 0;
    }
    plVar13 = (lws_h2_protocol_send *)lws_realloc((void *)0x0,0x38,"pps");
    if (plVar13 != (lws_h2_protocol_send *)0x0) {
      plVar13->type = LWS_H2_PPS_ACK_SETTINGS;
      lws_pps_schedule(wsi,plVar13);
      _lws_log(8,"%s: SETTINGS ack PPS\n","lws_h2_parse_end_of_frame");
      wsi->field_0x46e = wsi->field_0x46e | 0x40;
      goto LAB_00125bc5;
    }
    goto LAB_001257d8;
  case 6:
    if ((plVar4->flags & 1) != 0) {
      lws_validity_confirmed(wsi);
      return 0;
    }
    plVar13 = (lws_h2_protocol_send *)lws_realloc((void *)0x0,0x38,"pps");
    if (plVar13 != (lws_h2_protocol_send *)0x0) {
      plVar13->type = LWS_H2_PPS_PONG;
      _lws_log(8,"rx ping, preparing pong\n");
      (plVar13->u).rs = *(anon_struct_8_2_43e7303c_for_rs *)plVar4->ping_payload;
      lws_pps_schedule(wsi,plVar13);
      return 0;
    }
    goto LAB_001257d8;
  case 7:
    _lws_log(4,"GOAWAY: last sid %u, error 0x%08X, string \'%s\'\n",(ulong)plVar4->goaway_last_sid,
             (ulong)plVar4->goaway_err,plVar4->goaway_str);
LAB_001257d8:
    iVar11 = 1;
    break;
  case 8:
    uVar18 = plVar4->hpack_e_dep & 0x7fffffff;
    plVar4->hpack_e_dep = uVar18;
    _lws_log(8,"WINDOW_UPDATE: sid %u %u (0x%x)\n",uVar14,(ulong)uVar18,(ulong)uVar18);
    plVar12 = wsi;
    if ((plVar4->sid != 0) && (plVar12 = plVar4->swsi, plVar12 == (lws *)0x0)) {
      if (plVar4->sid <= plVar4->highest_sid_opened) {
        return 0;
      }
      pcVar19 = "alien sid";
      uVar20 = 1;
      goto LAB_00125d15;
    }
    if ((((plVar12->a).vhost)->options & 0x80000000) == 0) {
      uVar14 = (ulong)plVar4->hpack_e_dep;
      uVar18 = (plVar12->txc).tx_cr;
      lVar23 = (long)(int)uVar18;
    }
    else {
      uVar18 = (plVar12->txc).tx_cr;
      lVar23 = (long)(int)uVar18;
      uVar14 = (ulong)plVar4->hpack_e_dep;
      if (uVar14 + lVar23 >> 0x1f != 0) {
        uVar14 = (ulong)(uVar18 ^ 0x7fffffff);
        plVar4->hpack_e_dep = uVar18 ^ 0x7fffffff;
      }
    }
    if ((lVar23 + uVar14 & 0xffffffff80000000) != 0) {
      _lws_log(2,"%s: WINDOW_UPDATE 0x%llx + 0x%llx = 0x%llx, too high\n",
               "lws_h2_parse_end_of_frame");
      if (plVar4->sid != 0) {
        plVar12 = plVar4->swsi;
        pcVar19 = "Flow control exceeded max";
        uVar20 = 3;
        goto LAB_00125c63;
      }
      pcVar19 = "Flow control exceeded max";
      uVar20 = 3;
      goto LAB_00125d15;
    }
    if (uVar14 == 0) {
      pcVar19 = "Zero length window update";
      goto LAB_00125639;
    }
    txc = &plVar12->txc;
    (plVar12->txc).tx_cr = uVar18 + (int)uVar14;
    lws_wsi_txc_report_manual_txcr_in(plVar12,(int)uVar14);
    lws_wsi_txc_describe(txc,"WINDOW_UPDATE in",(plVar12->mux).my_sid);
    if (((int)uVar18 < 1) && (txc->tx_cr < 1)) {
      return 0;
    }
    for (wsi_00 = (wsi->mux).child_list; wsi_00 != (lws *)0x0; wsi_00 = (wsi_00->mux).sibling_list)
    {
      lws_callback_on_writable(wsi_00);
    }
    if ((plVar12->txc).skint == '\0') {
      return 0;
    }
    iVar11 = lws_h2_tx_cr_get(plVar12);
    iVar11 = lws_wsi_txc_check_skint(txc,iVar11);
    if (iVar11 != 0) {
      return 0;
    }
LAB_00125e61:
    iVar11 = 0;
    lws_callback_on_writable(plVar12);
  }
  return iVar11;
}

Assistant:

static int
lws_h2_parse_end_of_frame(struct lws *wsi)
{
	struct lws_h2_netconn *h2n = wsi->h2.h2n;
	struct lws *eff_wsi = wsi;
	const char *p;
	int n;

	h2n->frame_state = 0;
	h2n->count = 0;

	if (h2n->sid)
		h2n->swsi = lws_wsi_mux_from_id(wsi, h2n->sid);

	if (h2n->sid > h2n->highest_sid)
		h2n->highest_sid = h2n->sid;

	if (h2n->collected_priority && (h2n->dep & ~(1u << 31)) == h2n->sid) {
		lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR, "depends on own sid");
		return 0;
	}

	switch (h2n->type) {

	case LWS_H2_FRAME_TYPE_SETTINGS:

#if defined(LWS_WITH_CLIENT)
		if (wsi->client_h2_alpn && !wsi->client_mux_migrated &&
		    !(h2n->flags & LWS_H2_FLAG_SETTINGS_ACK)) {
			struct lws_h2_protocol_send *pps;

			/* migrate original client ask on to substream 1 */
#if defined(LWS_WITH_FILE_OPS)
			wsi->http.fop_fd = NULL;
#endif
			lwsl_info("%s: migrating\n", __func__);
			wsi->client_mux_migrated = 1;
			/*
			 * we need to treat the headers from the upgrade as the
			 * first job.  So these need to get shifted to sid 1.
			 */
			lws_context_lock(wsi->a.context, "h2 mig");
			lws_vhost_lock(wsi->a.vhost);

			h2n->swsi = __lws_wsi_server_new(wsi->a.vhost, wsi, 1);

			lws_vhost_unlock(wsi->a.vhost);
			lws_context_unlock(wsi->a.context);

			if (!h2n->swsi)
				return 1;
			h2n->sid = 1;

			assert(lws_wsi_mux_from_id(wsi, 1) == h2n->swsi);

		//	lws_role_transition(wsi, LWSIFR_CLIENT,
		//			    LRS_H2_WAITING_TO_SEND_HEADERS,
		//			    &role_ops_h2);

			lws_role_transition(h2n->swsi, LWSIFR_CLIENT,
					    LRS_H2_WAITING_TO_SEND_HEADERS,
					    &role_ops_h2);

			/* pass on the initial headers to SID 1 */
			h2n->swsi->http.ah = wsi->http.ah;
#if defined(LWS_WITH_SYS_FAULT_INJECTION)
			lws_fi_import(&h2n->swsi->fic, &wsi->fic);
#endif
			h2n->swsi->client_mux_substream = 1;
			h2n->swsi->client_h2_alpn = 1;
#if defined(LWS_WITH_CLIENT)
			h2n->swsi->flags = wsi->flags;
#if defined(LWS_WITH_CONMON)
			/* sid1 needs to represent the connection experience
			 * ... we take over responsibility for the DNS list
			 * copy as well
			 */
			h2n->swsi->conmon = wsi->conmon;
			h2n->swsi->conmon_datum = wsi->conmon_datum;
			h2n->swsi->sa46_peer = wsi->sa46_peer;
			wsi->conmon.dns_results_copy = NULL;
#endif
#endif /* CLIENT */

#if defined(LWS_WITH_SECURE_STREAMS)
			if (wsi->for_ss) {
				lws_ss_handle_t *h = (lws_ss_handle_t *)lws_get_opaque_user_data(wsi);

				h2n->swsi->for_ss = 1;
				wsi->for_ss = 0;

				if (h->wsi == wsi)
					h->wsi = h2n->swsi;
			}
#endif

			h2n->swsi->a.protocol = wsi->a.protocol;
			if (h2n->swsi->user_space &&
			    !h2n->swsi->user_space_externally_allocated)
				lws_free(h2n->swsi->user_space);
			h2n->swsi->user_space = wsi->user_space;
			h2n->swsi->user_space_externally_allocated =
					wsi->user_space_externally_allocated;
			h2n->swsi->a.opaque_user_data = wsi->a.opaque_user_data;
			wsi->a.opaque_user_data = NULL;
			h2n->swsi->txc.manual_initial_tx_credit =
					wsi->txc.manual_initial_tx_credit;

#if defined(LWS_WITH_TLS)
			lws_strncpy(h2n->swsi->alpn, wsi->alpn,
					sizeof(wsi->alpn));
#endif

			wsi->user_space = NULL;

			if (h2n->swsi->http.ah)
				h2n->swsi->http.ah->wsi = h2n->swsi;
			wsi->http.ah = NULL;

			lwsl_info("%s: MIGRATING nwsi %s -> swsi %s\n", __func__,
				  lws_wsi_tag(wsi), lws_wsi_tag(h2n->swsi));
			h2n->swsi->txc.tx_cr = (int32_t)
				h2n->peer_set.s[H2SET_INITIAL_WINDOW_SIZE];
			lwsl_info("%s: initial tx credit on %s: %d\n",
				  __func__, lws_wsi_tag(h2n->swsi),
				  (int)h2n->swsi->txc.tx_cr);
			h2n->swsi->h2.initialized = 1;

			/* set our initial window size */
			if (!wsi->h2.initialized) {
				wsi->txc.tx_cr = (int32_t)
				     h2n->peer_set.s[H2SET_INITIAL_WINDOW_SIZE];

				lwsl_info("%s: initial tx credit for us to "
					  "write on nwsi %s: %d\n", __func__,
					  lws_wsi_tag(wsi), (int)wsi->txc.tx_cr);
				wsi->h2.initialized = 1;
			}

			lws_callback_on_writable(h2n->swsi);

			if (!wsi->h2_acked_settings ||
			    !(wsi->flags & LCCSCF_H2_QUIRK_NGHTTP2_END_STREAM)
			) {
				pps = lws_h2_new_pps(LWS_H2_PPS_ACK_SETTINGS);
				if (!pps)
					return 1;
				lws_pps_schedule(wsi, pps);
				lwsl_info("%s: SETTINGS ack PPS\n", __func__);
				wsi->h2_acked_settings = 1;
			}

			/* also attach any queued guys */

			lws_wsi_mux_apply_queue(wsi);
		}
#endif
		break;

	case LWS_H2_FRAME_TYPE_CONTINUATION:
	case LWS_H2_FRAME_TYPE_HEADERS:

		if (!h2n->swsi)
			break;

		/* service the http request itself */

		if (h2n->last_action_dyntable_resize) {
			lws_h2_goaway(wsi, H2_ERR_COMPRESSION_ERROR,
				"dyntable resize last in headers");
			break;
		}

		if (!h2n->swsi->h2.END_HEADERS) {
			/* we are not finished yet */
			lwsl_info("witholding http action for continuation\n");
			h2n->cont_exp_sid = h2n->sid;
			h2n->cont_exp = 1;
			break;
		}

		/* confirm the hpack stream state is reasonable for finishing */

		if (h2n->hpack != HPKS_TYPE) {
			/* hpack incomplete */
			lwsl_info("hpack incomplete %d (type %d, len %u)\n",
				  h2n->hpack, h2n->type,
				  (unsigned int)h2n->hpack_len);
			lws_h2_goaway(wsi, H2_ERR_COMPRESSION_ERROR,
				      "hpack incomplete");
			break;
		}

		/* this is the last part of HEADERS */
		switch (h2n->swsi->h2.h2_state) {
		case LWS_H2_STATE_IDLE:
			lws_h2_state(h2n->swsi, LWS_H2_STATE_OPEN);
			break;
		case LWS_H2_STATE_RESERVED_REMOTE:
			lws_h2_state(h2n->swsi, LWS_H2_STATE_HALF_CLOSED_LOCAL);
			break;
		}

		lwsl_info("http req, %s, h2n->swsi=%s\n", lws_wsi_tag(wsi),
				lws_wsi_tag(h2n->swsi));
		h2n->swsi->hdr_parsing_completed = 1;

#if defined(LWS_WITH_CLIENT)
		if (h2n->swsi->client_mux_substream &&
		    lws_client_interpret_server_handshake(h2n->swsi)) {
			/*
			 * This is more complicated than it looks, one exit from
			 * interpret_server_handshake() is to do a close that
			 * turns into a redirect.
			 *
			 * In that case, the wsi survives having being reset
			 * and detached from any h2 identity.  We need to get
			 * our parents out from touching it any more
			 */
			lwsl_info("%s: cli int serv hs closed, or redir\n", __func__);
			return 2;
		}
#endif

		if (lws_hdr_extant(h2n->swsi, WSI_TOKEN_HTTP_CONTENT_LENGTH)) {
			const char *simp = lws_hdr_simple_ptr(h2n->swsi,
					      WSI_TOKEN_HTTP_CONTENT_LENGTH);

			if (!simp) /* coverity */
				return 1;
			h2n->swsi->http.rx_content_length = (unsigned long long)atoll(simp);
			h2n->swsi->http.rx_content_remain =
					h2n->swsi->http.rx_content_length;
			h2n->swsi->http.content_length_given = 1;
			lwsl_info("setting rx_content_length %lld\n",
				  (long long)h2n->swsi->http.rx_content_length);
		}

		{
			int n = 0, len;
			char buf[256];
			const unsigned char *c;

			do {
				c = lws_token_to_string((enum lws_token_indexes)n);
				if (!c) {
					n++;
					continue;
				}

				len = lws_hdr_total_length(h2n->swsi, (enum lws_token_indexes)n);
				if (!len || len > (int)sizeof(buf) - 1) {
					n++;
					continue;
				}

				if (lws_hdr_copy(h2n->swsi, buf, sizeof buf,
						(enum lws_token_indexes)n) < 0) {
					lwsl_info("    %s !oversize!\n",
						  (char *)c);
				} else {
					buf[sizeof(buf) - 1] = '\0';

					lwsl_info("    %s = %s\n",
						  (char *)c, buf);
				}
				n++;
			} while (c);
		}

		if (h2n->swsi->h2.h2_state == LWS_H2_STATE_HALF_CLOSED_REMOTE ||
		    h2n->swsi->h2.h2_state == LWS_H2_STATE_CLOSED) {
			lws_h2_goaway(wsi, H2_ERR_STREAM_CLOSED,
				      "Banning service on CLOSED_REMOTE");
			break;
		}

		switch (h2n->swsi->h2.h2_state) {
		case LWS_H2_STATE_IDLE:
			lws_h2_state(h2n->swsi, LWS_H2_STATE_OPEN);
			break;
		case LWS_H2_STATE_OPEN:
			if (h2n->swsi->h2.END_STREAM)
				lws_h2_state(h2n->swsi,
					     LWS_H2_STATE_HALF_CLOSED_REMOTE);
			break;
		case LWS_H2_STATE_HALF_CLOSED_LOCAL:
			if (h2n->swsi->h2.END_STREAM)
				/*
				 * action the END_STREAM
				 */
				lws_h2_state(h2n->swsi, LWS_H2_STATE_CLOSED);
			break;
		}

#if defined(LWS_WITH_CLIENT)

		/*
		 * If we already had the END_STREAM along with the END_HEADERS,
		 * we have already transitioned to STATE_CLOSED and we are not
		 * going to be doing anything further on this stream.
		 *
		 * In that case handle the transaction completion and
		 * finalize the stream for the peer
		 */

		if (h2n->swsi->h2.h2_state == LWS_H2_STATE_CLOSED &&
			h2n->swsi->client_mux_substream) {

			lws_h2_rst_stream(h2n->swsi, H2_ERR_NO_ERROR,
				"client done");

			if (lws_http_transaction_completed_client(h2n->swsi))
				lwsl_debug("tx completed returned close\n");
			break;
		}

		if (h2n->swsi->client_mux_substream) {
			lwsl_info("%s: %s: headers: client path (h2 state %s)\n",
				  __func__, lws_wsi_tag(wsi),
				  h2_state_names[h2n->swsi->h2.h2_state]);
			break;
		}
#endif

		if (!lws_hdr_total_length(h2n->swsi, WSI_TOKEN_HTTP_COLON_PATH) ||
		    !lws_hdr_total_length(h2n->swsi, WSI_TOKEN_HTTP_COLON_METHOD) ||
		    !lws_hdr_total_length(h2n->swsi, WSI_TOKEN_HTTP_COLON_SCHEME) ||
		     lws_hdr_total_length(h2n->swsi, WSI_TOKEN_HTTP_COLON_STATUS) ||
		     lws_hdr_extant(h2n->swsi, WSI_TOKEN_CONNECTION)) {
			lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
				      "Pseudoheader checks");
			break;
		}

		if (lws_hdr_extant(h2n->swsi, WSI_TOKEN_TE)) {
			n = lws_hdr_total_length(h2n->swsi, WSI_TOKEN_TE);

			if (n != 8 ||
			    !lws_hdr_simple_ptr(h2n->swsi, WSI_TOKEN_TE) ||
			    strncmp(lws_hdr_simple_ptr(h2n->swsi, WSI_TOKEN_TE),
				  "trailers", (unsigned int)n)) {
				lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
					      "Illegal transfer-encoding");
				break;
			}
		}

#if defined(LWS_WITH_HTTP_STREAM_COMPRESSION)
		lws_http_compression_validate(h2n->swsi);
#endif

		p = lws_hdr_simple_ptr(h2n->swsi, WSI_TOKEN_HTTP_COLON_METHOD);
		/*
		 * duplicate :path into the individual method uri header
		 * index, so that it looks the same as h1 in the ah
		 */
		for (n = 0; n < (int)LWS_ARRAY_SIZE(method_names); n++)
			if (p && !strcasecmp(p, method_names[n])) {
				h2n->swsi->http.ah->frag_index[method_index[n]] =
						h2n->swsi->http.ah->frag_index[
				                     WSI_TOKEN_HTTP_COLON_PATH];
				break;
			}

		{
			lwsl_debug("%s: setting DEF_ACT from 0x%x\n", __func__,
				   (unsigned int)h2n->swsi->wsistate);
			lwsi_set_state(h2n->swsi, LRS_DEFERRING_ACTION);
			lws_callback_on_writable(h2n->swsi);
		}
		break;

	case LWS_H2_FRAME_TYPE_DATA:
		lwsl_info("%s: DATA flags 0x%x\n", __func__, h2n->flags);
		if (!h2n->swsi)
			break;

		if (lws_hdr_total_length(h2n->swsi,
					 WSI_TOKEN_HTTP_CONTENT_LENGTH) &&
		    h2n->swsi->h2.END_STREAM &&
		    h2n->swsi->http.rx_content_length &&
		    h2n->swsi->http.rx_content_remain) {
			lws_h2_rst_stream(h2n->swsi, H2_ERR_PROTOCOL_ERROR,
					  "Not enough rx content");
			break;
		}

		if (h2n->swsi->h2.END_STREAM &&
		    h2n->swsi->h2.h2_state == LWS_H2_STATE_OPEN)
			lws_h2_state(h2n->swsi,
				     LWS_H2_STATE_HALF_CLOSED_REMOTE);

		if (h2n->swsi->h2.END_STREAM &&
		    h2n->swsi->h2.h2_state == LWS_H2_STATE_HALF_CLOSED_LOCAL)
			lws_h2_state(h2n->swsi, LWS_H2_STATE_CLOSED);

#if defined(LWS_WITH_CLIENT)
		/*
		 * client... remote END_STREAM implies we weren't going to
		 * send anything else anyway.
		 */

		if (h2n->swsi->client_mux_substream &&
		    (h2n->flags & LWS_H2_FLAG_END_STREAM)) {
			lwsl_info("%s: %s: DATA: end stream\n",
				  __func__, lws_wsi_tag(h2n->swsi));

			if (h2n->swsi->h2.h2_state == LWS_H2_STATE_OPEN) {
				lws_h2_state(h2n->swsi,
					     LWS_H2_STATE_HALF_CLOSED_REMOTE);
		//		lws_h2_rst_stream(h2n->swsi, H2_ERR_NO_ERROR,
		//				  "client done");

		//		if (lws_http_transaction_completed_client(h2n->swsi))
		//			lwsl_debug("tx completed returned close\n");
			}

			//if (h2n->swsi->h2.h2_state == LWS_H2_STATE_HALF_CLOSED_LOCAL)
			{
				lws_h2_state(h2n->swsi, LWS_H2_STATE_CLOSED);

				lws_h2_rst_stream(h2n->swsi, H2_ERR_NO_ERROR,
						  "client done");

				if (lws_http_transaction_completed_client(h2n->swsi))
					lwsl_debug("tx completed returned close\n");
			}
		}
#endif
		break;

	case LWS_H2_FRAME_TYPE_PING:
		if (h2n->flags & LWS_H2_FLAG_SETTINGS_ACK)
			lws_validity_confirmed(wsi);
		else {
			/* they're sending us a ping request */
			struct lws_h2_protocol_send *pps =
					lws_h2_new_pps(LWS_H2_PPS_PONG);
			if (!pps)
				return 1;

			lwsl_info("rx ping, preparing pong\n");

			memcpy(pps->u.ping.ping_payload, h2n->ping_payload, 8);
			lws_pps_schedule(wsi, pps);
		}

		break;

	case LWS_H2_FRAME_TYPE_WINDOW_UPDATE:
		/*
		 * We only have an unsigned 31-bit (positive) increment possible
		 */
		h2n->hpack_e_dep &= ~(1u << 31);
		lwsl_info("WINDOW_UPDATE: sid %u %u (0x%x)\n",
			  (unsigned int)h2n->sid,
			  (unsigned int)h2n->hpack_e_dep,
			  (unsigned int)h2n->hpack_e_dep);

		if (h2n->sid)
			eff_wsi = h2n->swsi;

		if (!eff_wsi) {
			if (h2n->sid > h2n->highest_sid_opened)
				lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
					      "alien sid");
			break; /* ignore */
		}

		if (eff_wsi->a.vhost->options &
		        LWS_SERVER_OPTION_H2_JUST_FIX_WINDOW_UPDATE_OVERFLOW &&
		    (uint64_t)eff_wsi->txc.tx_cr + (uint64_t)h2n->hpack_e_dep >
		    (uint64_t)0x7fffffff)
			h2n->hpack_e_dep = (uint32_t)(0x7fffffff - eff_wsi->txc.tx_cr);

		if ((uint64_t)eff_wsi->txc.tx_cr + (uint64_t)h2n->hpack_e_dep >
		    (uint64_t)0x7fffffff) {
			lwsl_warn("%s: WINDOW_UPDATE 0x%llx + 0x%llx = 0x%llx, too high\n",
					__func__, (unsigned long long)eff_wsi->txc.tx_cr,
					(unsigned long long)h2n->hpack_e_dep,
					(unsigned long long)eff_wsi->txc.tx_cr + (unsigned long long)h2n->hpack_e_dep);
			if (h2n->sid)
				lws_h2_rst_stream(h2n->swsi,
						  H2_ERR_FLOW_CONTROL_ERROR,
						  "Flow control exceeded max");
			else
				lws_h2_goaway(wsi, H2_ERR_FLOW_CONTROL_ERROR,
					      "Flow control exceeded max");
			break;
		}

		if (!h2n->hpack_e_dep) {
			lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
				      "Zero length window update");
			break;
		}
		n = eff_wsi->txc.tx_cr;
		eff_wsi->txc.tx_cr += (int32_t)h2n->hpack_e_dep;

		lws_wsi_txc_report_manual_txcr_in(eff_wsi,
						  (int32_t)h2n->hpack_e_dep);

		lws_wsi_txc_describe(&eff_wsi->txc, "WINDOW_UPDATE in",
				     eff_wsi->mux.my_sid);

		if (n <= 0 && eff_wsi->txc.tx_cr <= 0)
			/* it helps, but won't change sendability for anyone */
			break;

		/*
		 * It may have changed sendability (depends on SID 0 tx credit
		 * too)... for us and any children waiting on us... reassess
		 * blockage for all children first
		 */
		lws_start_foreach_ll(struct lws *, w, wsi->mux.child_list) {
			lws_callback_on_writable(w);
		} lws_end_foreach_ll(w, mux.sibling_list);

		if (eff_wsi->txc.skint &&
		    !lws_wsi_txc_check_skint(&eff_wsi->txc,
					     lws_h2_tx_cr_get(eff_wsi)))
			/*
			 * This one became un-skint, schedule a writeable
			 * callback
			 */
			lws_callback_on_writable(eff_wsi);

		break;

	case LWS_H2_FRAME_TYPE_GOAWAY:
		lwsl_notice("GOAWAY: last sid %u, error 0x%08X, string '%s'\n",
			  (unsigned int)h2n->goaway_last_sid,
			  (unsigned int)h2n->goaway_err, h2n->goaway_str);

		return 1;

	case LWS_H2_FRAME_TYPE_RST_STREAM:
		lwsl_info("LWS_H2_FRAME_TYPE_RST_STREAM: sid %u: reason 0x%x\n",
			  (unsigned int)h2n->sid,
			  (unsigned int)h2n->hpack_e_dep);
		break;

	case LWS_H2_FRAME_TYPE_COUNT: /* IGNORING FRAME */
		break;
	}

	return 0;
}